

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputData(Node *this,ostream *os)

{
  undefined8 uVar1;
  ostream *this_00;
  undefined1 local_70 [40];
  Node *Loop;
  undefined1 local_38 [40];
  ostream *os_local;
  Node *this_local;
  
  DataWidth = 0;
  local_38._32_8_ = os;
  os_local = (ostream *)this;
  Indent_abi_cxx11_((Node *)local_38);
  std::operator<<(os,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (this->Tree[0] == (Node *)0x0) {
    std::operator<<((ostream *)local_38._32_8_,"\"\"");
  }
  else {
    OutputDataValue(this->Tree[0],(ostream *)local_38._32_8_);
  }
  for (local_70._32_8_ = this->Tree[1]; (Node *)local_70._32_8_ != (Node *)0x0;
      local_70._32_8_ = ((Node **)(local_70._32_8_ + 0x28))[1]) {
    this_00 = std::operator<<((ostream *)local_38._32_8_,",");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    uVar1 = local_38._32_8_;
    DataWidth = 0;
    Indent_abi_cxx11_((Node *)local_70);
    std::operator<<((ostream *)uVar1,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    if (*(Node **)(local_70._32_8_ + 0x28) == (Node *)0x0) {
      std::operator<<((ostream *)local_38._32_8_,"\"\"");
    }
    else {
      OutputDataValue(*(Node **)(local_70._32_8_ + 0x28),(ostream *)local_38._32_8_);
    }
  }
  return;
}

Assistant:

void Node::OutputData(
	std::ostream& os	/**< Output stream */
)
{
	DataWidth = 0;
	os << Indent();

	//
	// Handle NULL values specially
	//
	if (Tree[0] == 0)
	{
		os << "\"\"";
	}
	else
	{
		Tree[0]->OutputDataValue(os);
	}

	//
	// Handle additional data statements attached to this one
	//
	Node* Loop = Tree[1];
	while (Loop != 0)
	{
		//
		// Let's start on a new line for each new
		// data statement, so we keep more of the
		// original formatting.
		//
		os << "," << std::endl;
		DataWidth = 0;
		os << Indent();

		//
		// Handle NULL values specially
		//
		if (Loop->Tree[0] == 0)
		{
			os << "\"\"";
		}
		else
		{
			Loop->Tree[0]->OutputDataValue(os);
		}
		Loop = Loop->Tree[1];
	}
}